

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall perfetto::base::PeriodicTask::Start(PeriodicTask *this,Args *args)

{
  function<void_()> *this_00;
  uint uVar1;
  uint32_t uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  TaskRunner *pTVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  TimeNanos TVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ScopedPlatformHandle tfd;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  local_88;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  local_84;
  element_type *local_80;
  undefined8 *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  itimerspec local_58;
  
  Reset(this);
  if ((args->period_ms != 0) && ((args->task).super__Function_base._M_manager != (_Manager_type)0x0)
     ) {
    (this->args_).period_ms = args->period_ms;
    this_00 = &(this->args_).task;
    std::function<void_()>::operator=(this_00,&args->task);
    bVar4 = args->use_suspend_aware_timer;
    (this->args_).start_first_task_immediately = args->start_first_task_immediately;
    (this->args_).use_suspend_aware_timer = bVar4;
    if ((this->args_).use_suspend_aware_timer == true) {
      uVar1 = (this->args_).period_ms;
      local_88.t_ = timerfd_create(7,0x80800);
      TVar7 = GetBootTimeNs();
      uVar5 = uVar1 - (int)(TVar7.__r % (long)(ulong)uVar1);
      local_58.it_value.tv_sec = (ulong)uVar5 / 1000;
      local_58.it_value.tv_nsec = (long)((uVar5 % 1000) * 1000000 + 1);
      local_58.it_interval.tv_sec = (ulong)uVar1 / 1000;
      local_58.it_interval.tv_nsec = (long)((uVar1 % 1000) * 1000000);
      iVar6 = timerfd_settime(local_88.t_,0,&local_58,(itimerspec *)0x0);
      if (iVar6 < 0) {
        local_84.t_ = -1;
      }
      else {
        local_84.t_ = local_88.t_;
        local_88.t_ = -1;
      }
      ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
      ::reset(&local_88,-1);
      ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
      ::reset(&this->timer_fd_,local_84.t_);
      local_84.t_ = -1;
      ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
      ::reset(&local_84,-1);
      if ((this->timer_fd_).t_ != -1) {
        local_80 = (this->weak_ptr_factory_).weak_ptr_.handle_.
                   super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        this_01 = (this->weak_ptr_factory_).weak_ptr_.handle_.
                  super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        pTVar3 = this->task_runner_;
        uVar1 = (this->timer_fd_).t_;
        uVar2 = this->generation_;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        local_68 = (code *)0x0;
        pcStack_60 = (code *)0x0;
        local_78 = (undefined8 *)0x0;
        uStack_70 = 0;
        local_78 = (undefined8 *)operator_new(0x20);
        *local_78 = RunTaskAndPostNext;
        *(uint32_t *)(local_78 + 1) = uVar2;
        local_78[2] = local_80;
        local_78[3] = this_01;
        pcStack_60 = std::
                     _Function_handler<void_(),_std::_Bind<void_(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int)>_>
                     ::_M_invoke;
        local_68 = std::
                   _Function_handler<void_(),_std::_Bind<void_(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int)>_>
                   ::_M_manager;
        (*pTVar3->_vptr_TaskRunner[4])(pTVar3,(ulong)uVar1);
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,3);
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
    }
    if ((this->timer_fd_).t_ == -1) {
      PostNextTask(this);
    }
    if ((this->args_).start_first_task_immediately == true) {
      if ((this->args_).task.super__Function_base._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
      (*(this->args_).task._M_invoker)((_Any_data *)this_00);
    }
  }
  return;
}

Assistant:

void PeriodicTask::Start(Args args) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  Reset();
  if (args.period_ms == 0 || !args.task) {
    PERFETTO_DCHECK(args.period_ms > 0);
    PERFETTO_DCHECK(args.task);
    return;
  }
  args_ = std::move(args);
  if (args_.use_suspend_aware_timer) {
    timer_fd_ = CreateTimerFd(args_.period_ms);
    if (timer_fd_) {
      auto weak_this = weak_ptr_factory_.GetWeakPtr();
      task_runner_->AddFileDescriptorWatch(
          *timer_fd_,
          std::bind(PeriodicTask::RunTaskAndPostNext, weak_this, generation_));
    } else {
      PERFETTO_DPLOG("timerfd not supported, falling back on PostDelayedTask");
    }
  }  // if (use_suspend_aware_timer).

  if (!timer_fd_)
    PostNextTask();

  if (args_.start_first_task_immediately)
    args_.task();
}